

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::TableModuleField::~TableModuleField(TableModuleField *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__TableModuleField_001d28d0;
  pcVar2 = (this->table).name._M_dataplus._M_p;
  paVar1 = &(this->table).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit TableModuleField(const Location& loc = Location(),
                            std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::Table>(loc), table(name) {}